

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O1

void expr_dsp(t_expr *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  t_float *ptVar6;
  long *plVar7;
  long lVar8;
  char *fmt;
  
  x->exp_error = 0;
  iVar1 = x->exp_vsize;
  iVar2 = (*sp)->s_n;
  x->exp_vsize = iVar2;
  iVar3 = x->exp_nexpr;
  if (0 < (long)iVar3) {
    plVar7 = &x->exp_res[0].ex_type;
    lVar8 = 0;
    do {
      *plVar7 = 0xf;
      ((ex_ex *)(plVar7 + -1))->ex_cont =
           (anon_union_8_5_735de1bb_for_ex_cont)sp[x->exp_nivec + lVar8]->s_vec;
      lVar8 = lVar8 + 1;
      plVar7 = plVar7 + 3;
    } while (iVar3 != lVar8);
  }
  uVar5 = 0;
  lVar8 = 0x6a0;
  do {
    if (((lVar8 == 0x6a0) || (lVar4 = *(long *)((long)x->exp_outlet + lVar8 + -0x50), lVar4 == 0x12)
        ) || (lVar4 == 0xe)) {
      if (x->exp_nivec <= (int)uVar5) {
        fmt = "expr_dsp int. err nv = %d, x->exp_nive = %d";
        goto LAB_0019f777;
      }
      *(t_sample **)((long)x->exp_outlet + lVar8 + -0x58) = sp[(int)uVar5]->s_vec;
      uVar5 = uVar5 + 1;
    }
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x1000);
  if ((uVar5 == x->exp_nivec) || ((uVar5 == 0 && (x->exp_nivec == 1)))) {
    dsp_add(expr_perform,1,x);
    if (x->exp_p_res[0] != (t_float *)0x0) {
      if (iVar1 == iVar2) {
        return;
      }
      if (0 < x->exp_nexpr) {
        lVar8 = 0;
        do {
          free(x->exp_p_res[lVar8]);
          free(x->exp_tmpres[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < x->exp_nexpr);
      }
      lVar8 = 0;
      do {
        free(x->exp_p_var[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 100);
    }
    iVar1 = x->exp_nexpr;
    if (0 < (long)iVar1) {
      iVar2 = x->exp_vsize;
      lVar8 = 0;
      do {
        ptVar6 = (t_float *)calloc((long)iVar2,4);
        x->exp_p_res[lVar8] = ptVar6;
        ptVar6 = (t_float *)calloc((long)iVar2,4);
        x->exp_tmpres[lVar8] = ptVar6;
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    iVar1 = x->exp_vsize;
    lVar8 = 0;
    do {
      ptVar6 = (t_float *)calloc((long)iVar1,4);
      x->exp_p_var[lVar8] = ptVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 100);
    return;
  }
  fmt = "expr_dsp internal error 2 nv = %d, x->exp_nive = %d";
LAB_0019f777:
  post(fmt,(ulong)uVar5);
  abort();
}

Assistant:

static void
expr_dsp(t_expr *x, t_signal **sp)
{
        int i, nv;
        int newsize;

        x->exp_error = 0;               /* reset all errors */
        newsize = (x->exp_vsize !=  sp[0]->s_n);
        x->exp_vsize = sp[0]->s_n;      /* record the vector size */
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_res[i].ex_type = ET_VEC;
                x->exp_res[i].ex_vec =  sp[x->exp_nivec + i]->s_vec;
        }
        for (i = 0, nv = 0; i < MAX_VARS; i++)
                /*
                 * the first inlet is always a signal
                 *
                 * SDY  We are warning the user till this limitation
                 * is taken away from pd
                 */
                if (!i || x->exp_var[i].ex_type == ET_VI ||
                                        x->exp_var[i].ex_type == ET_XI) {
                        if (nv >= x->exp_nivec) {
                          post("expr_dsp int. err nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                          abort();
                        }
                        x->exp_var[i].ex_vec  = sp[nv]->s_vec;
                        nv++;
                }
        /* we always have one inlet but we may not use it */
        if (nv != x->exp_nivec && (nv != 0 ||  x->exp_nivec != 1)) {
                post("expr_dsp internal error 2 nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                abort();
        }

        dsp_add(expr_perform, 1, (t_int *) x);

        /*
         * The buffer are now being allocated for expr~ and fexpr~
         * because if we have more than one expression we need the
         * temporary buffers, The save buffers are not really needed
        if (!IS_FEXPR_TILDE(x))
                return;
         */
        /*
         * if we have already allocated the buffers and we have a
         * new size free all the buffers
         */
        if (x->exp_p_res[0]) {
                if (!newsize)
                        return;
                /*
                 * if new size, reallocate all the previous buffers for fexpr~
                 */
                for (i = 0; i < x->exp_nexpr; i++) {
                        fts_free(x->exp_p_res[i]);
                        fts_free(x->exp_tmpres[i]);
                }
                for (i = 0; i < MAX_VARS; i++)
                        fts_free(x->exp_p_var[i]);

        }
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_p_res[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
                x->exp_tmpres[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
        }
        for (i = 0; i < MAX_VARS; i++)
                x->exp_p_var[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
}